

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::notify_variable_access
          (AnalyzeVariableScopeAccessHandler *this,uint32_t id,uint32_t block)

{
  bool bVar1;
  iterator iVar2;
  __ireturn_type *__return_storage_ptr__;
  value_type *__v;
  long *plVar3;
  long lStack_30;
  uint32_t id_local;
  uint32_t block_local;
  
  if (id != 0) {
    id_local = id;
    block_local = block;
    iVar2 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->rvalue_forward_children)._M_h,&id_local);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      plVar3 = (long *)((long)iVar2.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                              ._M_cur + 0x20);
      while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
        notify_variable_access(this,*(uint32_t *)(plVar3 + 1),block);
      }
    }
    bVar1 = id_is_phi_variable(this,id_local);
    if (bVar1) {
      lStack_30 = 0x18;
    }
    else {
      bVar1 = id_is_potential_temporary(this,id_local);
      if (!bVar1) {
        return;
      }
      lStack_30 = 0x50;
    }
    __return_storage_ptr__ =
         (__ireturn_type *)
         ::std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)((long)&(this->super_OpcodeHandler)._vptr_OpcodeHandler + lStack_30),
                      &id_local);
    ::std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert(__return_storage_ptr__,
             (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&block_local,__v);
  }
  return;
}

Assistant:

void Compiler::AnalyzeVariableScopeAccessHandler::notify_variable_access(uint32_t id, uint32_t block)
{
	if (id == 0)
		return;

	// Access chains used in multiple blocks mean hoisting all the variables used to construct the access chain as not all backends can use pointers.
	auto itr = rvalue_forward_children.find(id);
	if (itr != end(rvalue_forward_children))
		for (auto child_id : itr->second)
			notify_variable_access(child_id, block);

	if (id_is_phi_variable(id))
		accessed_variables_to_block[id].insert(block);
	else if (id_is_potential_temporary(id))
		accessed_temporaries_to_block[id].insert(block);
}